

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall llbuild::ninja::Lexer::lexPathString(Lexer *this,Token *result)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  while( true ) {
    while( true ) {
      pcVar1 = this->bufferPos;
      iVar4 = -1;
      if ((pcVar1 == (this->buffer).Data + (this->buffer).Length) ||
         (iVar4 = (int)*pcVar1, iVar4 != 0x24)) break;
      getNextChar(this);
      iVar4 = getNextChar(this);
      if (iVar4 == 10) {
        while( true ) {
          iVar4 = -1;
          if (this->bufferPos != (this->buffer).Data + (this->buffer).Length) {
            iVar4 = (int)*this->bufferPos;
          }
          bVar2 = isNonNewlineSpace(iVar4);
          if (!bVar2) break;
          getNextChar(this);
        }
      }
    }
    iVar3 = isspace(iVar4);
    if ((iVar3 != 0) || (((iVar4 == -1 || (iVar4 == 0x3a)) || (iVar4 == 0x7c)))) break;
    getNextChar(this);
  }
  result->tokenKind = String;
  result->length = (int)pcVar1 - *(int *)&result->start;
  return result;
}

Assistant:

Token &Lexer::lexPathString(Token &result) {
  // String tokens in path contexts consume until a space, ':', or '|'
  // character.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.

      // Consume the next character.
      c = getNextChar();

      // If the character was a newline, consume any leading spaces.
      if (c == '\n') {
        while (isNonNewlineSpace(peekNextChar()))
          getNextChar();
      }

      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (isspace(c) || c == ':' || c == '|' || c == -1)
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}